

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O0

map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
* __thiscall LatencyItem::dumpHistogram(LatencyItem *this)

{
  bool bVar1;
  uint64_t uVar2;
  long in_RSI;
  map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar3;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_unsigned_long>_>::value,_pair<iterator,_bool>_>
  _Var4;
  uint64_t cnt;
  HistItr *itr;
  HistItr *entry;
  iterator __end1;
  iterator __begin1;
  Histogram *__range1;
  map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  *ret;
  unsigned_long *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  _Rb_tree_iterator<std::pair<const_double,_unsigned_long>_> in_stack_ffffffffffffff18;
  Histogram *in_stack_ffffffffffffff38;
  HistItr local_60;
  HistItr local_38;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::
  map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  ::map((map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
         *)0x106a8e);
  local_20 = in_RSI + 0x20;
  Histogram::begin(in_stack_ffffffffffffff38);
  Histogram::end((Histogram *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  while (bVar1 = HistItr::operator!=(&local_38,&local_60), bVar1) {
    HistItr::operator*(&local_38);
    uVar2 = HistItr::getCount((HistItr *)0x106b35);
    if (uVar2 != 0) {
      HistItr::getUpperBound((HistItr *)in_stack_ffffffffffffff18._M_node);
      pVar3 = std::make_pair<unsigned_long,unsigned_long&>
                        ((unsigned_long *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                         in_stack_ffffffffffffff08);
      _Var4 = std::
              map<double,unsigned_long,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
              ::insert<std::pair<unsigned_long,unsigned_long>>
                        ((map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                          *)pVar3.second,
                         (pair<unsigned_long,_unsigned_long> *)in_stack_ffffffffffffff18._M_node);
      in_stack_ffffffffffffff18 = _Var4.first._M_node;
      in_stack_ffffffffffffff17 = _Var4.second;
    }
    HistItr::operator++(&local_38);
  }
  return in_RDI;
}

Assistant:

std::map<double, uint64_t> dumpHistogram() const {
        std::map<double, uint64_t> ret;
        for (auto& entry: hist) {
            HistItr& itr = entry;
            uint64_t cnt = itr.getCount();
            if (cnt) {
                ret.insert( std::make_pair(itr.getUpperBound(), cnt) );
            }
        }
        return ret;
    }